

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  uint64_t *puVar1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  secp256k1_fe *psVar11;
  ulong uVar12;
  int extraout_EDX;
  uint uVar13;
  uint extraout_EDX_00;
  ulong extraout_RDX;
  secp256k1_ge *a_01;
  secp256k1_ge *a_02;
  uint64_t unaff_RBP;
  ulong uVar14;
  secp256k1_gej *psVar15;
  ulong uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *r_00;
  ulong uVar19;
  secp256k1_gej *r_01;
  ulong uVar20;
  secp256k1_ge *a_03;
  secp256k1_gej *a_04;
  secp256k1_fe *unaff_R13;
  ulong uVar21;
  secp256k1_gej *psVar22;
  secp256k1_gej *a_05;
  ulong uVar23;
  secp256k1_fe s1;
  secp256k1_fe h3;
  secp256k1_fe h;
  secp256k1_fe u2;
  secp256k1_fe i;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_fe sStack_5f0;
  secp256k1_fe sStack_5c0;
  ulong uStack_590;
  secp256k1_gej *psStack_588;
  ulong uStack_580;
  ulong uStack_578;
  secp256k1_gej *psStack_570;
  secp256k1_gej *psStack_560;
  secp256k1_gej *psStack_558;
  secp256k1_gej *psStack_550;
  code *pcStack_548;
  int iStack_53c;
  secp256k1_gej *psStack_538;
  code *pcStack_530;
  ulong uStack_528;
  ulong uStack_520;
  secp256k1_gej *psStack_518;
  secp256k1_gej *psStack_510;
  secp256k1_gej *psStack_508;
  ulong uStack_500;
  secp256k1_gej *psStack_4f8;
  ulong uStack_4f0;
  secp256k1_fe *psStack_4e8;
  secp256k1_gej *psStack_4e0;
  undefined1 auStack_4d8 [56];
  uint64_t uStack_4a0;
  uint64_t uStack_498;
  uint64_t uStack_490;
  uint64_t uStack_488;
  int iStack_480;
  undefined1 auStack_478 [56];
  uint64_t uStack_440;
  uint64_t uStack_438;
  uint64_t uStack_430;
  uint64_t uStack_428;
  int iStack_420;
  int iStack_41c;
  undefined1 auStack_418 [56];
  ulong uStack_3e0;
  ulong uStack_3d8;
  secp256k1_gej *psStack_3d0;
  ulong uStack_3c8;
  ulong uStack_3c0;
  secp256k1_fe sStack_3b8;
  secp256k1_fe sStack_388;
  secp256k1_fe sStack_358;
  secp256k1_fe sStack_328;
  undefined1 auStack_2f8 [96];
  code *pcStack_298;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_gej *local_278;
  secp256k1_fe *local_270;
  secp256k1_gej *local_268;
  secp256k1_fe *local_260;
  secp256k1_gej *local_258;
  uint64_t local_250;
  secp256k1_gej *local_248;
  secp256k1_gej *local_240;
  secp256k1_fe *local_238;
  secp256k1_fe *local_230;
  uint64_t local_228;
  secp256k1_gej *local_220;
  undefined1 local_218 [56];
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  secp256k1_fe *local_1c8;
  int local_1c0;
  undefined1 local_1b8 [56];
  uint64_t local_180;
  uint64_t local_178;
  uint64_t local_170;
  uint64_t local_168;
  int local_160;
  undefined1 local_158 [56];
  uint64_t local_120;
  secp256k1_fe *local_118;
  secp256k1_gej *local_110;
  secp256k1_gej *local_108;
  ulong local_100;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  uint64_t local_98;
  uint64_t uStack_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  undefined8 local_70;
  secp256k1_fe local_60;
  
  psStack_280 = (secp256k1_gej *)0x146f71;
  psVar11 = rzr;
  psVar22 = a;
  secp256k1_gej_verify(a);
  psStack_280 = (secp256k1_gej *)0x146f79;
  psVar18 = (secp256k1_gej *)b;
  secp256k1_ge_verify(b);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
        rzr->magnitude = 1;
        rzr->normalized = 1;
        psStack_280 = (secp256k1_gej *)0x146fdf;
        secp256k1_fe_verify(rzr);
      }
      memcpy(r,a,0x98);
      return;
    }
    a_00 = &a->z;
    psStack_280 = (secp256k1_gej *)0x147020;
    local_278 = r;
    local_270 = rzr;
    secp256k1_fe_sqr(&local_60,a_00);
    local_f8.n[0] = (a->x).n[0];
    local_f8.n[1] = (a->x).n[1];
    local_f8.n[2] = (a->x).n[2];
    local_f8.n[3] = (a->x).n[3];
    local_f8.n[4] = (a->x).n[4];
    local_f8.magnitude = (a->x).magnitude;
    local_f8.normalized = (a->x).normalized;
    psStack_280 = (secp256k1_gej *)0x147055;
    secp256k1_fe_mul((secp256k1_fe *)(local_1b8 + 0x30),&b->x,&local_60);
    local_218._0_8_ = (a->y).n[0];
    local_218._8_8_ = (a->y).n[1];
    local_218._16_8_ = (a->y).n[2];
    local_218._24_8_ = (a->y).n[3];
    local_218._32_8_ = (a->y).n[4];
    local_218._40_4_ = (a->y).magnitude;
    local_218._44_4_ = (a->y).normalized;
    psStack_280 = (secp256k1_gej *)0x147099;
    local_268 = a;
    secp256k1_fe_mul(&local_c8,&b->y,&local_60);
    psStack_280 = (secp256k1_gej *)0x1470ac;
    local_230 = a_00;
    secp256k1_fe_mul(&local_c8,&local_c8,a_00);
    psStack_280 = (secp256k1_gej *)0x1470b4;
    secp256k1_fe_verify(&local_f8);
    psVar22 = (secp256k1_gej *)0x4;
    psStack_280 = (secp256k1_gej *)0x1470c1;
    secp256k1_fe_verify_magnitude(&local_f8,4);
    a = (secp256k1_gej *)(0x9ffff5ffffd9d6 - local_f8.n[0]);
    unaff_R13 = (secp256k1_fe *)(0x9ffffffffffff6 - local_f8.n[1]);
    r = (secp256k1_gej *)(0x9ffffffffffff6 - local_f8.n[2]);
    b = (secp256k1_ge *)(0x9ffffffffffff6 - local_f8.n[3]);
    unaff_RBP = 0x9fffffffffff6 - local_f8.n[4];
    local_1b8._40_8_ = 5;
    psStack_280 = (secp256k1_gej *)0x147127;
    local_1b8._0_8_ = a;
    local_1b8._8_8_ = unaff_R13;
    local_1b8._16_8_ = r;
    local_1b8._24_8_ = b;
    local_1b8._32_8_ = unaff_RBP;
    secp256k1_fe_verify((secp256k1_fe *)local_1b8);
    psStack_280 = (secp256k1_gej *)0x14712f;
    secp256k1_fe_verify((secp256k1_fe *)local_1b8);
    rzr = (secp256k1_fe *)(local_1b8 + 0x30);
    psStack_280 = (secp256k1_gej *)0x14713f;
    psVar18 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    if (0x1b < local_160) goto LAB_001477d5;
    local_220 = (secp256k1_gej *)((long)(a->x).n + local_1b8._48_8_);
    local_238 = (secp256k1_fe *)((long)unaff_R13->n + local_180);
    local_248 = (secp256k1_gej *)((long)(r->x).n + local_178);
    local_240 = (secp256k1_gej *)((long)(((secp256k1_gej *)b)->x).n + local_170);
    local_228 = unaff_RBP + local_168;
    local_1b8._44_4_ = 0;
    local_1b8._40_4_ = local_160 + 5;
    psStack_280 = (secp256k1_gej *)0x1471ba;
    local_1b8._0_8_ = local_220;
    local_1b8._8_8_ = local_238;
    local_1b8._16_8_ = local_248;
    local_1b8._24_8_ = local_240;
    local_1b8._32_8_ = local_228;
    secp256k1_fe_verify((secp256k1_fe *)local_1b8);
    psStack_280 = (secp256k1_gej *)0x1471ca;
    secp256k1_fe_verify(&local_c8);
    psVar22 = (secp256k1_gej *)0x1;
    psStack_280 = (secp256k1_gej *)0x1471d7;
    secp256k1_fe_verify_magnitude(&local_c8,1);
    rzr = (secp256k1_fe *)(0x3ffffbfffff0bc - local_c8.n[0]);
    unaff_RBP = 0x3ffffffffffffc - local_c8.n[1];
    unaff_R13 = (secp256k1_fe *)(0x3ffffffffffffc - local_c8.n[2]);
    r = (secp256k1_gej *)(0x3ffffffffffffc - local_c8.n[3]);
    a = (secp256k1_gej *)(0x3fffffffffffc - local_c8.n[4]);
    local_100 = 2;
    psStack_280 = (secp256k1_gej *)0x147242;
    local_158._48_8_ = rzr;
    local_120 = unaff_RBP;
    local_118 = unaff_R13;
    local_110 = r;
    local_108 = a;
    secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
    psStack_280 = (secp256k1_gej *)0x14724a;
    secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
    b = (secp256k1_ge *)local_218;
    psStack_280 = (secp256k1_gej *)0x147257;
    psVar18 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x1e < (int)local_218._40_4_) goto LAB_001477da;
    local_258 = (secp256k1_gej *)((long)(((secp256k1_gej *)rzr)->x).n + local_218._0_8_);
    local_250 = unaff_RBP + local_218._8_8_;
    unaff_RBP = 0xfffffffffffff;
    local_260 = (secp256k1_fe *)((long)unaff_R13->n + local_218._16_8_);
    psVar22 = (secp256k1_gej *)((long)(r->x).n + local_218._24_8_);
    psVar18 = (secp256k1_gej *)((long)(a->x).n + local_218._32_8_);
    local_100 = (ulong)(local_218._40_4_ + 2);
    psStack_280 = (secp256k1_gej *)0x1472d4;
    local_158._48_8_ = local_258;
    local_120 = local_250;
    local_118 = local_260;
    local_110 = psVar22;
    local_108 = psVar18;
    secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
    psStack_280 = (secp256k1_gej *)0x1472e1;
    secp256k1_fe_verify((secp256k1_fe *)local_1b8);
    unaff_R13 = local_270;
    r = local_278;
    uVar14 = (local_228 >> 0x30) * 0x1000003d1 + (long)local_220;
    psVar11 = (secp256k1_fe *)(uVar14 & 0xfffffffffffff);
    if ((psVar11 == (secp256k1_fe *)0xffffefffffc2f) || (psVar11 == (secp256k1_fe *)0x0)) {
      uVar23 = (long)local_238->n + (uVar14 >> 0x34);
      psVar11 = (secp256k1_fe *)((long)(local_248->x).n + (uVar23 >> 0x34));
      uVar21 = (long)(local_240->x).n + ((ulong)psVar11 >> 0x34);
      uVar8 = (uVar21 >> 0x34) + (local_228 & 0xffffffffffff);
      if ((((uVar23 | uVar14 | (ulong)psVar11 | uVar21) & 0xfffffffffffff) == 0 && uVar8 == 0) ||
         (((uVar14 | 0x1000003d0) & uVar23 & (ulong)psVar11 & uVar21 & (uVar8 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_280 = (secp256k1_gej *)0x1476e7;
        secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
        uVar14 = ((ulong)psVar18 >> 0x30) * 0x1000003d1 + (long)local_258;
        if (((uVar14 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar14 & 0xfffffffffffff) == 0)) {
          uVar12 = local_250 + (uVar14 >> 0x34);
          uVar21 = (long)local_260->n + (uVar12 >> 0x34);
          uVar8 = (long)(psVar22->x).n + (uVar21 >> 0x34);
          uVar23 = (uVar8 >> 0x34) + ((ulong)psVar18 & 0xffffffffffff);
          if ((((uVar12 | uVar14 | uVar21 | uVar8) & 0xfffffffffffff) == 0 && uVar23 == 0) ||
             (((uVar14 | 0x1000003d0) & uVar12 & uVar21 & uVar8 & (uVar23 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_280 = (secp256k1_gej *)0x1477be;
            secp256k1_gej_double_var(local_278,local_268,local_270);
            return;
          }
        }
        if (local_270 != (secp256k1_fe *)0x0) {
          *(undefined1 (*) [16])((long)local_270->n + 0x1c) = (undefined1  [16])0x0;
          local_270->n[2] = 0;
          local_270->n[3] = 0;
          local_270->n[0] = 0;
          local_270->n[1] = 0;
          local_270->normalized = 1;
          psStack_280 = (secp256k1_gej *)0x1477a0;
          secp256k1_fe_verify(local_270);
        }
        psStack_280 = (secp256k1_gej *)0x1477a9;
        secp256k1_gej_set_infinity(local_278);
        return;
      }
    }
    local_278->infinity = 0;
    if (local_270 != (secp256k1_fe *)0x0) {
      local_270->n[4] = local_1b8._32_8_;
      local_270->magnitude = local_1b8._40_4_;
      local_270->normalized = local_1b8._44_4_;
      local_270->n[2] = local_1b8._16_8_;
      local_270->n[3] = local_1b8._24_8_;
      local_270->n[0] = local_1b8._0_8_;
      local_270->n[1] = local_1b8._8_8_;
    }
    b = (secp256k1_ge *)local_1b8;
    psStack_280 = (secp256k1_gej *)0x1473f0;
    secp256k1_fe_mul(&local_278->z,local_230,(secp256k1_fe *)b);
    a = (secp256k1_gej *)&local_98;
    psStack_280 = (secp256k1_gej *)0x147403;
    secp256k1_fe_sqr((secp256k1_fe *)a,(secp256k1_fe *)b);
    psStack_280 = (secp256k1_gej *)0x14740b;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_280 = (secp256k1_gej *)0x147418;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_98 = 0x3ffffbfffff0bc - local_98;
    uStack_90 = 0x3ffffffffffffc - uStack_90;
    local_88 = 0x3ffffffffffffc - local_88;
    uStack_80 = 0x3ffffffffffffc - uStack_80;
    local_78 = 0x3fffffffffffc - local_78;
    local_70._0_4_ = 2;
    local_70._4_4_ = 0;
    psStack_280 = (secp256k1_gej *)0x147460;
    secp256k1_fe_verify((secp256k1_fe *)a);
    rzr = (secp256k1_fe *)(local_218 + 0x30);
    psStack_280 = (secp256k1_gej *)0x147476;
    secp256k1_fe_mul(rzr,(secp256k1_fe *)a,(secp256k1_fe *)b);
    psStack_280 = (secp256k1_gej *)0x14748e;
    secp256k1_fe_mul((secp256k1_fe *)local_158,&local_f8,(secp256k1_fe *)a);
    psVar22 = (secp256k1_gej *)(local_158 + 0x30);
    psStack_280 = (secp256k1_gej *)0x14749e;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar22);
    psStack_280 = (secp256k1_gej *)0x1474a6;
    secp256k1_fe_verify(&r->x);
    psStack_280 = (secp256k1_gej *)0x1474ae;
    psVar18 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar7 = local_1c0 + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_001477df;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_218._48_8_;
    (r->x).n[1] = uVar4 + uStack_1e0;
    (r->x).n[2] = uVar5 + local_1d8;
    (r->x).n[3] = uVar6 + uStack_1d0;
    puVar1 = (r->x).n + 4;
    *puVar1 = (long)local_1c8->n + *puVar1;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    psStack_280 = (secp256k1_gej *)0x147500;
    psVar11 = local_1c8;
    secp256k1_fe_verify(&r->x);
    psStack_280 = (secp256k1_gej *)0x147508;
    secp256k1_fe_verify(&r->x);
    rzr = (secp256k1_fe *)local_158;
    psStack_280 = (secp256k1_gej *)0x147518;
    psVar18 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar7 = local_158._40_4_ + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_001477e4;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_158;
    (r->x).n[0] = (r->x).n[0] + local_158._0_8_;
    (r->x).n[1] = uVar4 + local_158._8_8_;
    (r->x).n[2] = uVar5 + local_158._16_8_;
    (r->x).n[3] = uVar6 + local_158._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = (long)(uint64_t *)local_158._32_8_ + *puVar1;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    psStack_280 = (secp256k1_gej *)0x147567;
    psVar11 = (secp256k1_fe *)local_158._32_8_;
    secp256k1_fe_verify(&r->x);
    psStack_280 = (secp256k1_gej *)0x14756f;
    secp256k1_fe_verify(&r->x);
    psStack_280 = (secp256k1_gej *)0x147577;
    psVar18 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar7 = local_158._40_4_ + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_001477e9;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_158;
    (r->x).n[0] = (r->x).n[0] + local_158._0_8_;
    (r->x).n[1] = uVar4 + local_158._8_8_;
    (r->x).n[2] = uVar5 + local_158._16_8_;
    (r->x).n[3] = uVar6 + local_158._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = (long)(uint64_t *)local_158._32_8_ + *puVar1;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    psStack_280 = (secp256k1_gej *)0x1475c6;
    psVar11 = (secp256k1_fe *)local_158._32_8_;
    secp256k1_fe_verify(&r->x);
    psStack_280 = (secp256k1_gej *)0x1475ce;
    secp256k1_fe_verify(rzr);
    psStack_280 = (secp256k1_gej *)0x1475d6;
    psVar18 = r;
    secp256k1_fe_verify(&r->x);
    iVar7 = (r->x).magnitude + local_158._40_4_;
    if (0x20 < iVar7) goto LAB_001477ee;
    local_158._0_8_ = (r->x).n[0] + local_158._0_8_;
    local_158._8_8_ = (r->x).n[1] + local_158._8_8_;
    local_158._16_8_ = (r->x).n[2] + local_158._16_8_;
    local_158._24_8_ = (r->x).n[3] + local_158._24_8_;
    psVar11 = (secp256k1_fe *)(r->x).n[4];
    local_158._32_8_ = (long)psVar11->n + (long)(uint64_t *)local_158._32_8_;
    local_158._44_4_ = 0;
    psStack_280 = (secp256k1_gej *)0x147629;
    local_158._40_4_ = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)local_158);
    a = (secp256k1_gej *)&r->y;
    psStack_280 = (secp256k1_gej *)0x147640;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)local_158,(secp256k1_fe *)(local_158 + 0x30))
    ;
    rzr = (secp256k1_fe *)(local_218 + 0x30);
    psStack_280 = (secp256k1_gej *)0x147658;
    psVar22 = (secp256k1_gej *)rzr;
    secp256k1_fe_mul(rzr,rzr,(secp256k1_fe *)local_218);
    psStack_280 = (secp256k1_gej *)0x147660;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_280 = (secp256k1_gej *)0x147668;
    psVar18 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    local_1c0 = local_1c0 + (r->y).magnitude;
    if (local_1c0 < 0x21) {
      uVar4 = (r->y).n[1];
      uVar5 = (r->y).n[2];
      uVar6 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_218._48_8_;
      (r->y).n[1] = uVar4 + uStack_1e0;
      (r->y).n[2] = uVar5 + local_1d8;
      (r->y).n[3] = uVar6 + uStack_1d0;
      puVar1 = (r->y).n + 4;
      *puVar1 = (long)local_1c8->n + *puVar1;
      (r->y).magnitude = local_1c0;
      (r->y).normalized = 0;
      psStack_280 = (secp256k1_gej *)0x1476bc;
      secp256k1_fe_verify((secp256k1_fe *)a);
      psStack_280 = (secp256k1_gej *)0x1476c4;
      secp256k1_gej_verify(r);
      if (unaff_R13 != (secp256k1_fe *)0x0) {
        psStack_280 = (secp256k1_gej *)0x1476d5;
        secp256k1_fe_verify(unaff_R13);
      }
      return;
    }
  }
  else {
    if (rzr == (secp256k1_fe *)0x0) {
      secp256k1_gej_set_ge(r,b);
      return;
    }
    psStack_280 = (secp256k1_gej *)0x1477d5;
    secp256k1_gej_add_ge_var_cold_1();
LAB_001477d5:
    psStack_280 = (secp256k1_gej *)0x1477da;
    secp256k1_gej_add_ge_var_cold_8();
LAB_001477da:
    psStack_280 = (secp256k1_gej *)0x1477df;
    secp256k1_gej_add_ge_var_cold_7();
LAB_001477df:
    psStack_280 = (secp256k1_gej *)0x1477e4;
    secp256k1_gej_add_ge_var_cold_6();
LAB_001477e4:
    psStack_280 = (secp256k1_gej *)0x1477e9;
    secp256k1_gej_add_ge_var_cold_5();
LAB_001477e9:
    psStack_280 = (secp256k1_gej *)0x1477ee;
    secp256k1_gej_add_ge_var_cold_4();
LAB_001477ee:
    psStack_280 = (secp256k1_gej *)0x1477f3;
    secp256k1_gej_add_ge_var_cold_3();
  }
  psStack_280 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_gej_add_ge_var_cold_2();
  psStack_288 = r;
  psStack_280 = (secp256k1_gej *)rzr;
  if ((extraout_RDX & 1) == 0) {
    pcStack_298 = (code *)0x1478c4;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_001478c4:
    pcStack_298 = (code *)0x1478c9;
    secp256k1_ecmult_table_get_ge_storage_cold_1();
  }
  else {
    uVar10 = (uint)extraout_RDX;
    if ((int)uVar10 < -0x3fff) goto LAB_001478c4;
    if ((int)uVar10 < 0x4000) {
      if (0 < (int)uVar10) {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)psVar18,
                   (secp256k1_ge_storage *)((long)&psVar22->x + (ulong)(uVar10 - 1 >> 1) * 0x40));
        return;
      }
      pcStack_298 = (code *)0x147851;
      secp256k1_ge_from_storage
                ((secp256k1_ge *)psVar18,
                 (secp256k1_ge_storage *)((long)&psVar22->x + (ulong)(~uVar10 >> 1) * 0x40));
      psVar11 = &psVar18->y;
      pcStack_298 = (code *)0x14785d;
      secp256k1_fe_verify(psVar11);
      pcStack_298 = (code *)0x14786a;
      secp256k1_fe_verify_magnitude(psVar11,1);
      uVar4 = (psVar18->y).n[1];
      uVar5 = (psVar18->y).n[2];
      uVar6 = (psVar18->y).n[3];
      (psVar18->y).n[0] = 0x3ffffbfffff0bc - (psVar18->y).n[0];
      (psVar18->y).n[1] = 0x3ffffffffffffc - uVar4;
      (psVar18->y).n[2] = 0x3ffffffffffffc - uVar5;
      (psVar18->y).n[3] = 0x3ffffffffffffc - uVar6;
      (psVar18->y).n[4] = 0x3fffffffffffc - (psVar18->y).n[4];
      (psVar18->y).magnitude = 2;
      (psVar18->y).normalized = 0;
      secp256k1_fe_verify(psVar11);
      return;
    }
  }
  pcStack_298 = secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  pcStack_530 = (code *)0x1478f3;
  auStack_2f8._56_8_ = r;
  auStack_2f8._64_8_ = b;
  auStack_2f8._72_8_ = unaff_R13;
  auStack_2f8._80_8_ = rzr;
  auStack_2f8._88_8_ = a;
  pcStack_298 = (code *)unaff_RBP;
  secp256k1_gej_verify(psVar22);
  pcStack_530 = (code *)0x1478fb;
  secp256k1_ge_verify(a_01);
  pcStack_530 = (code *)0x147903;
  secp256k1_fe_verify(psVar11);
  if (psVar22->infinity != 0) {
    psVar18->infinity = a_01->infinity;
    pcStack_530 = (code *)0x14792f;
    secp256k1_fe_sqr(&sStack_3b8,psVar11);
    pcStack_530 = (code *)0x147945;
    secp256k1_fe_mul(&sStack_328,&sStack_3b8,psVar11);
    pcStack_530 = (code *)0x147953;
    secp256k1_fe_mul(&psVar18->x,&a_01->x,&sStack_3b8);
    pcStack_530 = (code *)0x147966;
    secp256k1_fe_mul(&psVar18->y,&a_01->y,&sStack_328);
    psVar22 = (secp256k1_gej *)&psVar18->z;
    (psVar18->z).n[0] = 1;
    (psVar18->z).n[1] = 0;
    (psVar18->z).n[2] = 0;
    (psVar18->z).n[3] = 0;
    (psVar18->z).n[4] = 0;
    (psVar18->z).magnitude = 1;
    (psVar18->z).normalized = 1;
LAB_00147991:
    pcStack_530 = (code *)0x147996;
    secp256k1_fe_verify(&psVar22->x);
    pcStack_530 = (code *)0x14799e;
    secp256k1_gej_verify(psVar18);
    return;
  }
  if (a_01->infinity != 0) {
    memcpy(psVar18,psVar22,0x98);
    return;
  }
  psStack_4e8 = &psVar22->z;
  pcStack_530 = (code *)0x1479f5;
  secp256k1_fe_mul(&sStack_3b8,psStack_4e8,psVar11);
  pcStack_530 = (code *)0x147a08;
  secp256k1_fe_sqr(&sStack_328,&sStack_3b8);
  sStack_388.n[0] = (psVar22->x).n[0];
  sStack_388.n[1] = (psVar22->x).n[1];
  sStack_388.n[2] = (psVar22->x).n[2];
  sStack_388.n[3] = (psVar22->x).n[3];
  sStack_388.n[4] = (psVar22->x).n[4];
  sStack_388.magnitude = (psVar22->x).magnitude;
  sStack_388.normalized = (psVar22->x).normalized;
  pcStack_530 = (code *)0x147a3d;
  secp256k1_fe_mul((secp256k1_fe *)auStack_478,&a_01->x,&sStack_328);
  auStack_4d8._0_8_ = (psVar22->y).n[0];
  auStack_4d8._8_8_ = (psVar22->y).n[1];
  auStack_4d8._16_8_ = (psVar22->y).n[2];
  auStack_4d8._24_8_ = (psVar22->y).n[3];
  auStack_4d8._32_8_ = (psVar22->y).n[4];
  auStack_4d8._40_4_ = (psVar22->y).magnitude;
  auStack_4d8._44_4_ = (psVar22->y).normalized;
  pcStack_530 = (code *)0x147a7e;
  psStack_518 = psVar22;
  secp256k1_fe_mul(&sStack_358,&a_01->y,&sStack_328);
  pcStack_530 = (code *)0x147a91;
  secp256k1_fe_mul(&sStack_358,&sStack_358,&sStack_3b8);
  pcStack_530 = (code *)0x147a99;
  secp256k1_fe_verify(&sStack_388);
  psVar15 = (secp256k1_gej *)0x4;
  pcStack_530 = (code *)0x147aa6;
  secp256k1_fe_verify_magnitude(&sStack_388,4);
  psVar22 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_388.n[0]);
  uVar21 = 0x9ffffffffffff6 - sStack_388.n[1];
  uVar14 = 0x9ffffffffffff6 - sStack_388.n[2];
  a_04 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_388.n[3]);
  uStack_520 = 0x9fffffffffff6 - sStack_388.n[4];
  uStack_3c0 = 5;
  pcStack_530 = (code *)0x147b14;
  auStack_418._48_8_ = psVar22;
  uStack_3e0 = uVar21;
  uStack_3d8 = uVar14;
  psStack_3d0 = a_04;
  uStack_3c8 = uStack_520;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
  pcStack_530 = (code *)0x147b1c;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
  a_05 = (secp256k1_gej *)auStack_478;
  pcStack_530 = (code *)0x147b2c;
  r_00 = a_05;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  if ((int)auStack_478._40_4_ < 0x1c) {
    psStack_4e0 = (secp256k1_gej *)((long)(psVar22->x).n + auStack_478._0_8_);
    uStack_4f0 = uVar21 + auStack_478._8_8_;
    uStack_500 = uVar14 + auStack_478._16_8_;
    psStack_4f8 = (secp256k1_gej *)((long)(a_04->x).n + auStack_478._24_8_);
    uStack_520 = uStack_520 + auStack_478._32_8_;
    uStack_3c0 = (ulong)(auStack_478._40_4_ + 5);
    pcStack_530 = (code *)0x147bac;
    auStack_418._48_8_ = psStack_4e0;
    uStack_3e0 = uStack_4f0;
    uStack_3d8 = uStack_500;
    psStack_3d0 = psStack_4f8;
    uStack_3c8 = uStack_520;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    pcStack_530 = (code *)0x147bbc;
    secp256k1_fe_verify(&sStack_358);
    psVar15 = (secp256k1_gej *)0x1;
    pcStack_530 = (code *)0x147bc9;
    secp256k1_fe_verify_magnitude(&sStack_358,1);
    a_05 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_358.n[0]);
    psVar22 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_358.n[1]);
    uStack_528 = 0x3ffffffffffffc - sStack_358.n[2];
    uVar14 = 0x3ffffffffffffc - sStack_358.n[3];
    uVar21 = 0x3fffffffffffc - sStack_358.n[4];
    auStack_418._40_8_ = 2;
    pcStack_530 = (code *)0x147c39;
    auStack_418._0_8_ = a_05;
    auStack_418._8_8_ = psVar22;
    auStack_418._16_8_ = uStack_528;
    auStack_418._24_8_ = uVar14;
    auStack_418._32_8_ = uVar21;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    pcStack_530 = (code *)0x147c41;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    a_04 = (secp256k1_gej *)auStack_4d8;
    pcStack_530 = (code *)0x147c4e;
    r_00 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    if (0x1e < (int)auStack_4d8._40_4_) goto LAB_00148175;
    psStack_510 = (secp256k1_gej *)((long)(a_05->x).n + auStack_4d8._0_8_);
    psStack_508 = (secp256k1_gej *)((long)(psVar22->x).n + auStack_4d8._8_8_);
    uVar23 = uStack_528 + auStack_4d8._16_8_;
    uStack_528 = uVar14 + auStack_4d8._24_8_;
    uVar14 = uVar21 + auStack_4d8._32_8_;
    uVar21 = 0x1000003d0;
    auStack_418._44_4_ = 0;
    auStack_418._40_4_ = auStack_4d8._40_4_ + 2;
    pcStack_530 = (code *)0x147cd1;
    auStack_418._0_8_ = psStack_510;
    auStack_418._8_8_ = psStack_508;
    auStack_418._16_8_ = uVar23;
    auStack_418._24_8_ = uStack_528;
    auStack_418._32_8_ = uVar14;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    pcStack_530 = (code *)0x147cde;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    uVar8 = (uStack_520 >> 0x30) * 0x1000003d1 + (long)psStack_4e0;
    if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
      uVar19 = uStack_4f0 + (uVar8 >> 0x34);
      uVar12 = (uVar19 >> 0x34) + uStack_500;
      uVar20 = (long)(psStack_4f8->x).n + (uVar12 >> 0x34);
      uVar16 = (uVar20 >> 0x34) + (uStack_520 & 0xffffffffffff);
      if ((((uVar19 | uVar8 | uVar12 | uVar20) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
         (((uVar8 | 0x1000003d0) & uVar19 & uVar12 & uVar20 & (uVar16 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        pcStack_530 = (code *)0x1480a1;
        secp256k1_fe_verify((secp256k1_fe *)auStack_418);
        uVar21 = (uVar14 >> 0x30) * 0x1000003d1 + (long)psStack_510;
        if (((uVar21 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar21 & 0xfffffffffffff) == 0)) {
          uVar12 = (long)(psStack_508->x).n + (uVar21 >> 0x34);
          uVar23 = (uVar12 >> 0x34) + uVar23;
          uVar8 = (uVar23 >> 0x34) + uStack_528;
          uVar14 = (uVar8 >> 0x34) + (uVar14 & 0xffffffffffff);
          if ((((uVar12 | uVar21 | uVar23 | uVar8) & 0xfffffffffffff) == 0 && uVar14 == 0) ||
             (((uVar21 | 0x1000003d0) & uVar12 & uVar23 & uVar8 & (uVar14 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            pcStack_530 = (code *)0x14816b;
            secp256k1_gej_double_var(psVar18,psStack_518,(secp256k1_fe *)0x0);
            return;
          }
        }
        pcStack_530 = (code *)0x148157;
        secp256k1_gej_set_infinity(psVar18);
        return;
      }
    }
    psVar18->infinity = 0;
    a_05 = (secp256k1_gej *)(auStack_418 + 0x30);
    pcStack_530 = (code *)0x147dc7;
    secp256k1_fe_mul(&psVar18->z,psStack_4e8,(secp256k1_fe *)a_05);
    psVar22 = (secp256k1_gej *)auStack_2f8;
    pcStack_530 = (code *)0x147dda;
    secp256k1_fe_sqr((secp256k1_fe *)psVar22,(secp256k1_fe *)a_05);
    pcStack_530 = (code *)0x147de2;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    pcStack_530 = (code *)0x147def;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar22,1);
    auStack_2f8._0_8_ = 0x3ffffbfffff0bc - auStack_2f8._0_8_;
    auStack_2f8._8_8_ = 0x3ffffffffffffc - auStack_2f8._8_8_;
    auStack_2f8._16_8_ = 0x3ffffffffffffc - auStack_2f8._16_8_;
    auStack_2f8._24_8_ = 0x3ffffffffffffc - auStack_2f8._24_8_;
    auStack_2f8._32_8_ = 0x3fffffffffffc - auStack_2f8._32_8_;
    auStack_2f8._40_4_ = 2;
    auStack_2f8._44_4_ = 0;
    pcStack_530 = (code *)0x147e37;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    a_04 = (secp256k1_gej *)(auStack_4d8 + 0x30);
    pcStack_530 = (code *)0x147e4d;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)psVar22,(secp256k1_fe *)a_05);
    pcStack_530 = (code *)0x147e65;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_478 + 0x30),&sStack_388,(secp256k1_fe *)psVar22);
    psVar15 = (secp256k1_gej *)auStack_418;
    pcStack_530 = (code *)0x147e75;
    secp256k1_fe_sqr(&psVar18->x,(secp256k1_fe *)psVar15);
    pcStack_530 = (code *)0x147e7d;
    secp256k1_fe_verify(&psVar18->x);
    pcStack_530 = (code *)0x147e85;
    r_00 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iVar7 = iStack_480 + (psVar18->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014817a;
    uVar4 = (psVar18->x).n[1];
    uVar5 = (psVar18->x).n[2];
    uVar6 = (psVar18->x).n[3];
    (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_4d8._48_8_;
    (psVar18->x).n[1] = uVar4 + uStack_4a0;
    (psVar18->x).n[2] = uVar5 + uStack_498;
    (psVar18->x).n[3] = uVar6 + uStack_490;
    puVar1 = (psVar18->x).n + 4;
    *puVar1 = *puVar1 + uStack_488;
    (psVar18->x).magnitude = iVar7;
    (psVar18->x).normalized = 0;
    pcStack_530 = (code *)0x147ed8;
    secp256k1_fe_verify(&psVar18->x);
    pcStack_530 = (code *)0x147ee0;
    secp256k1_fe_verify(&psVar18->x);
    psVar22 = (secp256k1_gej *)(auStack_478 + 0x30);
    pcStack_530 = (code *)0x147ef0;
    r_00 = psVar22;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    iVar7 = iStack_420 + (psVar18->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014817f;
    uVar4 = (psVar18->x).n[1];
    uVar5 = (psVar18->x).n[2];
    uVar6 = (psVar18->x).n[3];
    psVar22 = (secp256k1_gej *)(auStack_478 + 0x30);
    (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_478._48_8_;
    (psVar18->x).n[1] = uVar4 + uStack_440;
    (psVar18->x).n[2] = uVar5 + uStack_438;
    (psVar18->x).n[3] = uVar6 + uStack_430;
    puVar1 = (psVar18->x).n + 4;
    *puVar1 = *puVar1 + uStack_428;
    (psVar18->x).magnitude = iVar7;
    (psVar18->x).normalized = 0;
    pcStack_530 = (code *)0x147f3f;
    secp256k1_fe_verify(&psVar18->x);
    pcStack_530 = (code *)0x147f47;
    secp256k1_fe_verify(&psVar18->x);
    pcStack_530 = (code *)0x147f4f;
    r_00 = psVar22;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    iVar7 = iStack_420 + (psVar18->x).magnitude;
    if (0x20 < iVar7) goto LAB_00148184;
    uVar4 = (psVar18->x).n[1];
    uVar5 = (psVar18->x).n[2];
    uVar6 = (psVar18->x).n[3];
    psVar22 = (secp256k1_gej *)(auStack_478 + 0x30);
    (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_478._48_8_;
    (psVar18->x).n[1] = uVar4 + uStack_440;
    (psVar18->x).n[2] = uVar5 + uStack_438;
    (psVar18->x).n[3] = uVar6 + uStack_430;
    puVar1 = (psVar18->x).n + 4;
    *puVar1 = *puVar1 + uStack_428;
    (psVar18->x).magnitude = iVar7;
    (psVar18->x).normalized = 0;
    pcStack_530 = (code *)0x147f9e;
    secp256k1_fe_verify(&psVar18->x);
    pcStack_530 = (code *)0x147fa6;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    pcStack_530 = (code *)0x147fae;
    r_00 = psVar18;
    secp256k1_fe_verify(&psVar18->x);
    iVar7 = (psVar18->x).magnitude + iStack_420;
    if (0x20 < iVar7) goto LAB_00148189;
    auStack_478._48_8_ = (psVar18->x).n[0] + auStack_478._48_8_;
    uStack_440 = (psVar18->x).n[1] + uStack_440;
    uStack_438 = (psVar18->x).n[2] + uStack_438;
    uStack_430 = (psVar18->x).n[3] + uStack_430;
    uStack_428 = uStack_428 + (psVar18->x).n[4];
    iStack_41c = 0;
    pcStack_530 = (code *)0x148001;
    iStack_420 = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_478 + 0x30));
    psVar22 = (secp256k1_gej *)&psVar18->y;
    pcStack_530 = (code *)0x148018;
    secp256k1_fe_mul((secp256k1_fe *)psVar22,(secp256k1_fe *)(auStack_478 + 0x30),
                     (secp256k1_fe *)auStack_418);
    a_05 = (secp256k1_gej *)(auStack_4d8 + 0x30);
    pcStack_530 = (code *)0x148030;
    psVar15 = a_05;
    secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)a_05,(secp256k1_fe *)auStack_4d8);
    pcStack_530 = (code *)0x148038;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    pcStack_530 = (code *)0x148040;
    r_00 = a_05;
    secp256k1_fe_verify((secp256k1_fe *)a_05);
    iStack_480 = iStack_480 + (psVar18->y).magnitude;
    if (iStack_480 < 0x21) {
      uVar4 = (psVar18->y).n[1];
      uVar5 = (psVar18->y).n[2];
      uVar6 = (psVar18->y).n[3];
      (psVar18->y).n[0] = (psVar18->y).n[0] + auStack_4d8._48_8_;
      (psVar18->y).n[1] = uVar4 + uStack_4a0;
      (psVar18->y).n[2] = uVar5 + uStack_498;
      (psVar18->y).n[3] = uVar6 + uStack_490;
      puVar1 = (psVar18->y).n + 4;
      *puVar1 = *puVar1 + uStack_488;
      (psVar18->y).magnitude = iStack_480;
      (psVar18->y).normalized = 0;
      goto LAB_00147991;
    }
  }
  else {
    pcStack_530 = (code *)0x148175;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00148175:
    pcStack_530 = (code *)0x14817a;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0014817a:
    pcStack_530 = (code *)0x14817f;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0014817f:
    pcStack_530 = (code *)0x148184;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00148184:
    pcStack_530 = (code *)0x148189;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_00148189:
    pcStack_530 = (code *)0x14818e;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  pcStack_530 = secp256k1_scalar_cadd_bit;
  secp256k1_gej_add_zinv_var_cold_1();
  uVar8 = (ulong)psVar15 & 0xffffffff;
  pcStack_548 = (code *)0x1481a4;
  psVar17 = psVar15;
  r_01 = r_00;
  psStack_538 = psVar18;
  pcStack_530 = (code *)uVar14;
  iStack_53c = extraout_EDX;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if ((uint)psVar15 < 0x100) {
    uVar10 = iStack_53c - 1U & 0x100 | (uint)psVar15;
    uVar13 = uVar10 >> 6;
    bVar9 = (byte)uVar8;
    uVar23 = (ulong)(uVar10 < 0x40) << (bVar9 & 0x3f);
    psVar17 = (secp256k1_gej *)((ulong)(uVar13 == 1) << (bVar9 & 0x3f));
    uVar20 = (ulong)(uVar13 == 2) << (bVar9 & 0x3f);
    uVar16 = (ulong)(uVar13 == 3) << (bVar9 & 0x3f);
    uVar14 = (r_00->x).n[0];
    (r_00->x).n[0] = (r_00->x).n[0] + uVar23;
    puVar1 = (r_00->x).n + 1;
    uVar23 = (ulong)CARRY8(uVar14,uVar23);
    uVar14 = *puVar1;
    uVar12 = (long)(psVar17->x).n + *puVar1;
    *puVar1 = uVar12 + uVar23;
    puVar1 = (r_00->x).n + 2;
    uVar23 = (ulong)(CARRY8(uVar14,(ulong)psVar17) || CARRY8(uVar12,uVar23));
    uVar14 = *puVar1;
    uVar12 = *puVar1 + uVar20;
    *puVar1 = uVar12 + uVar23;
    puVar1 = (r_00->x).n + 3;
    uVar23 = (ulong)(CARRY8(uVar14,uVar20) || CARRY8(uVar12,uVar23));
    uVar14 = *puVar1;
    uVar12 = *puVar1 + uVar16;
    *puVar1 = uVar12 + uVar23;
    bVar2 = !CARRY8(uVar14,uVar16);
    bVar3 = !CARRY8(uVar12,uVar23);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar2 && bVar3);
    pcStack_548 = (code *)0x14820c;
    r_01 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (bVar2 && bVar3) {
      return;
    }
  }
  else {
    pcStack_548 = (code *)0x14821d;
    secp256k1_scalar_cadd_bit_cold_2();
  }
  pcStack_548 = secp256k1_scalar_get_bits_var;
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_570 = (secp256k1_gej *)0x148236;
  psVar18 = psVar17;
  psVar15 = r_01;
  psStack_560 = r_00;
  psStack_558 = psVar22;
  psStack_550 = a_05;
  pcStack_548 = (code *)uVar8;
  secp256k1_scalar_verify((secp256k1_scalar *)r_01);
  if (extraout_EDX_00 - 0x21 < 0xffffffe0) {
    psStack_570 = (secp256k1_gej *)0x1482a2;
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else {
    uVar10 = extraout_EDX_00 + (uint)psVar17;
    if (uVar10 < 0x101) {
      if (uVar10 - 1 >> 6 == (uint)(((ulong)psVar17 & 0xffffffff) >> 6)) {
        psStack_570 = (secp256k1_gej *)0x148261;
        secp256k1_scalar_verify((secp256k1_scalar *)r_01);
        return;
      }
      if ((uint)psVar17 < 0xc0) {
        return;
      }
      goto LAB_001482a7;
    }
  }
  psStack_570 = (secp256k1_gej *)0x1482a7;
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001482a7:
  psStack_570 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_590 = (ulong)extraout_EDX_00;
  psStack_588 = a_04;
  uStack_580 = uVar21;
  uStack_578 = (ulong)psVar17 & 0xffffffff;
  psStack_570 = r_01;
  secp256k1_gej_verify(psVar18);
  a_03 = a_02;
  secp256k1_fe_verify(&a_02->x);
  if (psVar18->infinity == 0) {
    secp256k1_fe_sqr(&sStack_5c0,&a_02->x);
    secp256k1_fe_mul(&sStack_5f0,&sStack_5c0,&a_02->x);
    secp256k1_fe_mul(&psVar15->x,&psVar18->x,&sStack_5c0);
    secp256k1_fe_mul(&psVar15->y,&psVar18->y,&sStack_5f0);
    *(int *)(psVar15->z).n = psVar18->infinity;
    secp256k1_ge_verify((secp256k1_ge *)psVar15);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_03->infinity = 1;
  (a_03->x).n[0] = 0;
  (a_03->x).n[1] = 0;
  (a_03->x).n[2] = 0;
  (a_03->x).n[3] = 0;
  *(undefined8 *)((long)(a_03->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_03->x).n + 0x24) = 0;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  *(undefined8 *)((long)(a_03->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_03->y).n + 0x24) = 0;
  (a_03->y).n[2] = 0;
  (a_03->y).n[3] = 0;
  (a_03->y).n[0] = 0;
  (a_03->y).n[1] = 0;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  secp256k1_ge_verify(a_03);
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* Operations: 8 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
    if (rzr != NULL) SECP256K1_FE_VERIFY(rzr);
}